

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::
     RenderLineSegments<ImPlot::GetterXsYs<signed_char>,ImPlot::GetterXsYRef<signed_char>,ImPlot::TransformerLinLog>
               (GetterXsYs<signed_char> *getter1,GetterXsYRef<signed_char> *getter2,
               TransformerLinLog *transformer,ImDrawList *DrawList,float line_weight,ImU32 col)

{
  float *pfVar1;
  double dVar2;
  ImVec2 IVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  ImPlotPlot *pIVar7;
  double dVar8;
  float fVar9;
  ImPlotContext *pIVar10;
  ImPlotContext *pIVar11;
  ImPlotContext *pIVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  float fVar16;
  float fVar17;
  ImVec2 p2;
  ImVec2 p1;
  ImVec2 local_60;
  undefined1 local_58 [8];
  GetterXsYRef<signed_char> *local_50;
  TransformerLinLog *local_48;
  int local_40;
  ImU32 local_3c;
  float local_38;
  
  pIVar10 = GImPlot;
  if (((GImPlot->CurrentPlot->Flags & 0x1000) == 0) && ((GImPlot->Style).AntiAliasedLines != true))
  {
    local_40 = getter2->Count;
    if (getter1->Count < getter2->Count) {
      local_40 = getter1->Count;
    }
    local_58 = (undefined1  [8])getter1;
    local_50 = getter2;
    local_48 = transformer;
    local_3c = col;
    local_38 = line_weight;
    RenderPrimitives<ImPlot::LineSegmentsRenderer<ImPlot::GetterXsYs<signed_char>,ImPlot::GetterXsYRef<signed_char>,ImPlot::TransformerLinLog>>
              ((LineSegmentsRenderer<ImPlot::GetterXsYs<signed_char>,_ImPlot::GetterXsYRef<signed_char>,_ImPlot::TransformerLinLog>
                *)local_58,DrawList,&GImPlot->CurrentPlot->PlotRect);
  }
  else {
    iVar14 = getter2->Count;
    if (getter1->Count < getter2->Count) {
      iVar14 = getter1->Count;
    }
    if (0 < iVar14) {
      iVar15 = 0;
      do {
        pIVar11 = GImPlot;
        iVar5 = getter1->Count;
        lVar13 = (long)(((getter1->Offset + iVar15) % iVar5 + iVar5) % iVar5) *
                 (long)getter1->Stride;
        cVar4 = getter1->Xs[lVar13];
        dVar8 = log10((double)(int)getter1->Ys[lVar13] /
                      GImPlot->CurrentPlot->YAxis[transformer->YAxis].Range.Min);
        pIVar12 = GImPlot;
        iVar5 = transformer->YAxis;
        pIVar7 = pIVar11->CurrentPlot;
        dVar2 = pIVar7->YAxis[iVar5].Range.Min;
        IVar3 = pIVar11->PixelRange[iVar5].Min;
        local_58._4_4_ =
             (float)(pIVar11->My[iVar5] *
                     (((double)(float)(dVar8 / pIVar11->LogDenY[iVar5]) *
                       (pIVar7->YAxis[iVar5].Range.Max - dVar2) + dVar2) - dVar2) + (double)IVar3.y)
        ;
        local_58._0_4_ =
             (float)(pIVar11->Mx * ((double)(int)cVar4 - (pIVar7->XAxis).Range.Min) +
                    (double)IVar3.x);
        iVar6 = getter2->Count;
        cVar4 = getter2->Xs
                [(long)(((getter2->Offset + iVar15) % iVar6 + iVar6) % iVar6) *
                 (long)getter2->Stride];
        dVar8 = log10(getter2->YRef / GImPlot->CurrentPlot->YAxis[iVar5].Range.Min);
        iVar5 = transformer->YAxis;
        pIVar7 = pIVar12->CurrentPlot;
        dVar2 = pIVar7->YAxis[iVar5].Range.Min;
        IVar3 = pIVar12->PixelRange[iVar5].Min;
        fVar16 = (float)(pIVar12->Mx * ((double)(int)cVar4 - (pIVar7->XAxis).Range.Min) +
                        (double)IVar3.x);
        fVar17 = (float)(pIVar12->My[iVar5] *
                         (((double)(float)(dVar8 / pIVar12->LogDenY[iVar5]) *
                           (pIVar7->YAxis[iVar5].Range.Max - dVar2) + dVar2) - dVar2) +
                        (double)IVar3.y);
        local_60.y = fVar17;
        local_60.x = fVar16;
        pIVar7 = pIVar10->CurrentPlot;
        fVar9 = (float)local_58._4_4_;
        if (fVar17 <= (float)local_58._4_4_) {
          fVar9 = fVar17;
        }
        if ((fVar9 < (pIVar7->PlotRect).Max.y) &&
           (fVar9 = (float)(~-(uint)(fVar17 <= (float)local_58._4_4_) & (uint)fVar17 |
                           local_58._4_4_ & -(uint)(fVar17 <= (float)local_58._4_4_)),
           pfVar1 = &(pIVar7->PlotRect).Min.y, *pfVar1 <= fVar9 && fVar9 != *pfVar1)) {
          fVar9 = (float)local_58._0_4_;
          if (fVar16 <= (float)local_58._0_4_) {
            fVar9 = fVar16;
          }
          if ((fVar9 < (pIVar7->PlotRect).Max.x) &&
             (fVar9 = (float)(-(uint)(fVar16 <= (float)local_58._0_4_) & local_58._0_4_ |
                             ~-(uint)(fVar16 <= (float)local_58._0_4_) & (uint)fVar16),
             (pIVar7->PlotRect).Min.x <= fVar9 && fVar9 != (pIVar7->PlotRect).Min.x)) {
            ImDrawList::AddLine(DrawList,(ImVec2 *)local_58,&local_60,col,line_weight);
          }
        }
        iVar15 = iVar15 + 1;
      } while (iVar14 != iVar15);
    }
  }
  return;
}

Assistant:

inline void RenderLineSegments(const Getter1& getter1, const Getter2& getter2, const Transformer& transformer, ImDrawList& DrawList, float line_weight, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(gp.CurrentPlot->Flags, ImPlotFlags_AntiAliased) || gp.Style.AntiAliasedLines) {
        int I = ImMin(getter1.Count, getter2.Count);
        for (int i = 0; i < I; ++i) {
            ImVec2 p1 = transformer(getter1(i));
            ImVec2 p2 = transformer(getter2(i));
            if (gp.CurrentPlot->PlotRect.Overlaps(ImRect(ImMin(p1, p2), ImMax(p1, p2))))
                DrawList.AddLine(p1, p2, col, line_weight);
        }
    }
    else {
        RenderPrimitives(LineSegmentsRenderer<Getter1,Getter2,Transformer>(getter1, getter2, transformer, col, line_weight), DrawList, gp.CurrentPlot->PlotRect);
    }
}